

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

PtrTokenOrSyntax * __thiscall
slang::syntax::ConstraintPrototypeSyntax::getChildPtr
          (PtrTokenOrSyntax *__return_storage_ptr__,ConstraintPrototypeSyntax *this,size_t index)

{
  PtrTokenOrSyntax *pPVar1;
  __index_type *p_Var2;
  
  switch(this) {
  case (ConstraintPrototypeSyntax *)0x0:
    p_Var2 = (__index_type *)(__return_storage_ptr__ + 2);
    break;
  case (ConstraintPrototypeSyntax *)0x1:
    p_Var2 = (__index_type *)
             ((long)&__return_storage_ptr__[5].
                     super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                     super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>
             + 8);
    break;
  case (ConstraintPrototypeSyntax *)0x2:
    pPVar1 = __return_storage_ptr__ + 8;
    goto LAB_00203d69;
  case (ConstraintPrototypeSyntax *)0x3:
    p_Var2 = (__index_type *)(__return_storage_ptr__ + 10);
    break;
  case (ConstraintPrototypeSyntax *)0x4:
    p_Var2 = *(__index_type **)
              &__return_storage_ptr__[0xd].
               super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Copy_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
               super__Variant_storage_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>;
    break;
  case (ConstraintPrototypeSyntax *)0x5:
    pPVar1 = __return_storage_ptr__ + 0xd;
LAB_00203d69:
    return (PtrTokenOrSyntax *)
           (__index_type *)
           ((long)&(pPVar1->super_variant<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>).
                   super__Variant_base<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Copy_assign_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*>.
                   super__Move_ctor_alias<slang::parsing::Token_*,_slang::syntax::SyntaxNode_*> + 8)
    ;
  default:
    return (PtrTokenOrSyntax *)0x0;
  }
  return (PtrTokenOrSyntax *)p_Var2;
}

Assistant:

PtrTokenOrSyntax ConstraintPrototypeSyntax::getChildPtr(size_t index) {
    switch (index) {
        case 0: return &attributes;
        case 1: return &qualifiers;
        case 2: return &keyword;
        case 3: return &specifiers;
        case 4: return name.get();
        case 5: return &semi;
        default: return nullptr;
    }
}